

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReparserTester.cpp
# Opt level: O0

void __thiscall psy::C::ReparserTester::case0015(ReparserTester *this)

{
  initializer_list<psy::C::SyntaxKind> __l;
  Expectation *pEVar1;
  allocator<psy::C::SyntaxKind> local_219;
  SyntaxKind local_218 [12];
  iterator local_200;
  size_type local_1f8;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1f0;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1d8;
  Expectation local_1c0;
  Expectation local_108;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *s;
  ReparserTester *this_local;
  
  local_18 = "\nint _ ( )\n{\n    typedef x y ;\n    y * z ;\n}\n";
  s = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"\nint _ ( )\n{\n    typedef x y ;\n    y * z ;\n}\n",&local_39);
  Expectation::Expectation(&local_1c0);
  local_218[0] = DeclarationStatement;
  local_218[1] = TypedefDeclaration;
  local_218[2] = TypedefStorageClass;
  local_218[3] = TypedefName;
  local_218[4] = IdentifierDeclarator;
  local_218[5] = DeclarationStatement;
  local_218[6] = VariableAndOrFunctionDeclaration;
  local_218[7] = TypedefName;
  local_218[8] = PointerDeclarator;
  local_218[9] = IdentifierDeclarator;
  local_200 = local_218;
  local_1f8 = 10;
  std::allocator<psy::C::SyntaxKind>::allocator(&local_219);
  __l._M_len = local_1f8;
  __l._M_array = local_200;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            (&local_1f0,__l,&local_219);
  preamble_clean(&local_1d8,&local_1f0);
  pEVar1 = Expectation::AST(&local_1c0,&local_1d8);
  Expectation::Expectation(&local_108,pEVar1);
  reparse_withSyntaxCorrelation(this,&local_38,&local_108);
  Expectation::~Expectation(&local_108);
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~vector(&local_1d8);
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~vector(&local_1f0);
  std::allocator<psy::C::SyntaxKind>::~allocator(&local_219);
  Expectation::~Expectation(&local_1c0);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void ReparserTester::case0015()
{
    auto s = R"(
int _ ( )
{
    typedef x y ;
    y * z ;
}
)";

    reparse_withSyntaxCorrelation(
                s,
                Expectation().AST(
                    preamble_clean(
                        { SyntaxKind::DeclarationStatement,
                          SyntaxKind::TypedefDeclaration,
                          SyntaxKind::TypedefStorageClass,
                          SyntaxKind::TypedefName,
                          SyntaxKind::IdentifierDeclarator,
                          SyntaxKind::DeclarationStatement,
                          SyntaxKind::VariableAndOrFunctionDeclaration,
                          SyntaxKind::TypedefName,
                          SyntaxKind::PointerDeclarator,
                          SyntaxKind::IdentifierDeclarator })));
}